

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O2

void __thiscall OpenMD::VectorAccumulator::clear(VectorAccumulator *this)

{
  (this->super_BaseAccumulator).Count_ = 0;
  Vector<double,_3U>::operator=
            (&(this->Avg_).super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
  Vector<double,_3U>::operator=
            (&(this->Avg2_).super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
  Vector<double,_3U>::operator=
            (&(this->Total_).super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
  Vector<double,_3U>::operator=
            (&(this->Val_).super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
  this->AvgLen_ = 0.0;
  this->AvgLen2_ = 0.0;
  return;
}

Assistant:

void clear() {
      Count_   = 0;
      Avg_     = V3Zero;
      Avg2_    = V3Zero;
      Total_   = V3Zero;
      Val_     = V3Zero;
      AvgLen_  = 0;
      AvgLen2_ = 0;
    }